

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void doctest::detail::registerReporterImpl
               (char *name,int priority,reporterCreatorFunc c,bool isReporter)

{
  size_t sVar1;
  char *pcVar2;
  undefined3 in_register_00000009;
  anon_union_24_2_13149d16_for_String_3 local_68;
  pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
  local_50;
  
  local_50.first.first = priority;
  local_50.second = c;
  if (CONCAT31(in_register_00000009,isReporter) == 0) {
    anon_unknown_15::getListeners();
    sVar1 = strlen(name);
    pcVar2 = String::allocate((String *)&local_68.data,(size_type)sVar1);
    memcpy(pcVar2,name,sVar1 & 0xffffffff);
    local_50.first.second.field_0.data.ptr = (char *)CONCAT71(local_68._1_7_,local_68.buf[0]);
    local_50.first.second.field_0._8_8_ = local_68._8_8_;
    local_50.first.second.field_0.buf[0x17] = local_68.buf[0x17];
    local_68.buf[0] = '\0';
    local_68.buf[0x17] = '\x17';
    std::
    _Rb_tree<std::pair<int,doctest::String>,std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>,std::_Select1st<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>,std::less<std::pair<int,doctest::String>>,std::allocator<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>>
    ::
    _M_insert_unique<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>
              ((_Rb_tree<std::pair<int,doctest::String>,std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>,std::_Select1st<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>,std::less<std::pair<int,doctest::String>>,std::allocator<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>>
                *)&anon_unknown_15::getListeners::data,&local_50);
  }
  else {
    anon_unknown_15::getReporters();
    sVar1 = strlen(name);
    pcVar2 = String::allocate((String *)&local_68.data,(size_type)sVar1);
    memcpy(pcVar2,name,sVar1 & 0xffffffff);
    local_50.first.second.field_0.data.ptr = (char *)CONCAT71(local_68._1_7_,local_68.buf[0]);
    local_50.first.second.field_0._8_8_ = local_68._8_8_;
    local_50.first.second.field_0.buf[0x17] = local_68.buf[0x17];
    local_68.buf[0] = '\0';
    local_68.buf[0x17] = '\x17';
    std::
    _Rb_tree<std::pair<int,doctest::String>,std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>,std::_Select1st<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>,std::less<std::pair<int,doctest::String>>,std::allocator<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>>
    ::
    _M_insert_unique<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>
              ((_Rb_tree<std::pair<int,doctest::String>,std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>,std::_Select1st<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>,std::less<std::pair<int,doctest::String>>,std::allocator<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>>
                *)&anon_unknown_15::getReporters::data,&local_50);
  }
  if ((local_50.first.second.field_0.buf[0x17] < '\0') &&
     (local_50.first.second.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_50.first.second.field_0.data.ptr);
  }
  if ((local_68.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_68._1_7_,local_68.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_68._1_7_,local_68.buf[0]));
  }
  return;
}

Assistant:

void registerReporterImpl(const char* name, int priority, reporterCreatorFunc c, bool isReporter) {
        if(isReporter)
            getReporters().insert(reporterMap::value_type(reporterMap::key_type(priority, name), c));
        else
            getListeners().insert(reporterMap::value_type(reporterMap::key_type(priority, name), c));
    }